

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_common.c
# Opt level: O1

void av1_loop_restoration_filter_frame_mt
               (YV12_BUFFER_CONFIG *frame,AV1_COMMON *cm,int optimized_lr,AVxWorker *workers,
               int num_workers,AV1LrSync *lr_sync,void *lr_ctxt,int do_extend_border)

{
  uint8_t uVar1;
  int iVar2;
  int iVar3;
  SequenceHeader *pSVar4;
  AV1LrMTInfo *pAVar5;
  LRWorkerData *pLVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  AVxWorkerInterface *pAVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  int iVar16;
  RestorationInfo *pRVar17;
  int iVar18;
  AV1LrSync *pAVar19;
  long lVar20;
  long lVar21;
  uint uVar22;
  long lVar23;
  AVxWorker *worker;
  int *piVar24;
  AVxWorker *pAVar25;
  bool bVar26;
  FilterFrameCtxt *ctxt;
  aom_internal_error_info error_info;
  aom_internal_error_info local_1d0;
  
  pAVar19 = lr_sync;
  av1_loop_restoration_filter_frame_init
            ((AV1LrStruct *)lr_ctxt,frame,cm,optimized_lr,
             (uint)(cm->seq_params->monochrome == '\0') * 2 + 1);
  uVar22 = (uint)(cm->seq_params->monochrome == '\0') * 2 + 1;
  pAVar12 = aom_get_worker_interface();
  piVar24 = &cm->rst_info[0].restoration_unit_size;
  lVar23 = 0;
  iVar9 = 0;
  do {
    if (((RestorationInfo *)(piVar24 + -1))->frame_restoration_type != RESTORE_NONE) {
      iVar11 = *(int *)((long)lr_ctxt + lVar23 + 0x1c);
      iVar2 = *piVar24;
      iVar8 = av1_lr_count_units(iVar2,iVar11);
      if (iVar9 <= iVar8) {
        iVar9 = av1_lr_count_units(iVar2,iVar11);
      }
    }
    iVar11 = (int)pAVar19;
    lVar23 = lVar23 + 0x38;
    piVar24 = piVar24 + 0x10;
  } while ((ulong)uVar22 * 0x38 - lVar23 != 0);
  if ((((lr_sync->sync_range == 0) || (lr_sync->rows < iVar9)) ||
      (lr_sync->num_workers < num_workers)) || (lr_sync->num_planes < (int)uVar22)) {
    av1_loop_restoration_dealloc(lr_sync);
    av1_loop_restoration_alloc(lr_sync,cm,num_workers,iVar9,uVar22,iVar11);
  }
  lr_sync->lr_mt_exit = false;
  uVar15 = 0;
  do {
    memset(lr_sync->cur_sb_col[uVar15],0xff,(long)iVar9 << 2);
    uVar15 = uVar15 + 1;
  } while (uVar22 != uVar15);
  pSVar4 = cm->seq_params;
  uVar1 = pSVar4->monochrome;
  pAVar5 = lr_sync->job_queue;
  lr_sync->jobs_enqueued = 0;
  lr_sync->jobs_dequeued = 0;
  lVar23 = (ulong)(uVar1 == '\0') * 2 + 1;
  lVar14 = 0;
  local_1d0.has_detail = 0;
  pRVar17 = cm->rst_info;
  do {
    if (pRVar17->frame_restoration_type != RESTORE_NONE) {
      local_1d0.has_detail =
           local_1d0.has_detail + (*(int *)(*(long *)((long)lr_ctxt + lVar14 + 8) + 0xc) + 1 >> 1);
    }
    lVar14 = lVar14 + 0x38;
    pRVar17 = pRVar17 + 1;
  } while (lVar23 * 0x38 - lVar14 != 0);
  local_1d0.error_code = AOM_CODEC_OK;
  lVar14 = 0;
  do {
    if (cm->rst_info[lVar14].frame_restoration_type != RESTORE_NONE) {
      bVar26 = false;
      if (lVar14 != 0) {
        bVar26 = pSVar4->subsampling_y != 0;
      }
      iVar9 = *(int *)((long)lr_ctxt + lVar14 * 0x38 + 0x1c);
      if (0 < iVar9) {
        lVar20 = *(long *)((long)lr_ctxt + lVar14 * 0x38 + 8);
        iVar11 = *(int *)(lVar20 + 4);
        iVar2 = lr_sync->jobs_enqueued;
        uVar22 = 0;
        iVar8 = 0;
        do {
          iVar16 = iVar9 - iVar8;
          if ((iVar11 * 3) / 2 <= iVar9 - iVar8) {
            iVar16 = iVar11;
          }
          iVar16 = iVar16 + iVar8;
          iVar8 = iVar8 - (8U >> bVar26);
          iVar13 = 0;
          if (0 < iVar8) {
            iVar13 = iVar8;
          }
          uVar10 = 8U >> bVar26;
          if (iVar9 <= iVar16) {
            uVar10 = 0;
          }
          iVar18 = iVar16 - uVar10;
          uVar10 = uVar22 & 1;
          iVar3 = *(int *)(local_1d0.detail + (ulong)uVar10 * 4 + -8);
          pAVar5[iVar3].lr_unit_row = uVar22;
          pAVar5[iVar3].plane = (int)lVar14;
          pAVar5[iVar3].v_start = iVar13;
          pAVar5[iVar3].v_end = iVar18;
          pAVar5[iVar3].sync_mode = uVar10;
          if ((uVar22 & 1) == 0) {
            pAVar5[iVar3].v_copy_start = iVar13 + 3;
            pAVar5[iVar3].v_copy_end = iVar18 + -3;
            if (uVar22 == 0) {
              pAVar5[iVar3].v_copy_start = 0;
            }
            if (uVar22 == *(int *)(lVar20 + 0xc) - 1U) {
              pAVar5[iVar3].v_copy_end = iVar9;
            }
          }
          else {
            if (iVar8 < 4) {
              iVar8 = 3;
            }
            pAVar5[iVar3].v_copy_start = iVar8 + -3;
            iVar8 = iVar18 + 3;
            if (iVar9 <= iVar18 + 3) {
              iVar8 = iVar9;
            }
            pAVar5[iVar3].v_copy_end = iVar8;
          }
          uVar22 = uVar22 + 1;
          *(int *)(local_1d0.detail + (ulong)uVar10 * 4 + -8) = iVar3 + 1;
          iVar8 = iVar16;
        } while (iVar16 < iVar9);
        lr_sync->jobs_enqueued = iVar2 + uVar22;
      }
    }
    lVar14 = lVar14 + 1;
  } while (lVar14 != lVar23);
  uVar15 = (ulong)(uint)num_workers;
  if (0 < num_workers) {
    lVar23 = uVar15 + 1;
    lVar21 = uVar15 * 0x1c0;
    lVar20 = 0;
    lVar14 = lVar21;
    do {
      lVar7 = lVar20 + uVar15 * 0x38;
      pAVar25 = (AVxWorker *)((long)&workers[uVar15 - 1].impl_ + lVar20);
      pLVar6 = lr_sync->lrworkerdata;
      *(void **)((long)pLVar6 + lVar20 * 8 + lVar21 + -0x1b0) = lr_ctxt;
      *(int *)((long)pLVar6 + lVar20 * 8 + lVar21 + -0x1a8) = do_extend_border;
      *(code **)((long)workers + lVar7 + -0x20) = loop_restoration_row_worker;
      *(AV1LrSync **)((long)workers + lVar7 + -0x18) = lr_sync;
      *(char **)((long)workers + lVar7 + -0x10) = pLVar6[-1].error_info.detail + lVar14 + -0x28;
      *(undefined4 *)((long)workers + lVar7 + -8) = 0;
      if (uVar15 * 0x38 + lVar20 == 0x38) {
        (*pAVar12->execute)(pAVar25);
      }
      else {
        (*pAVar12->launch)(pAVar25);
      }
      lVar23 = lVar23 + -1;
      lVar20 = lVar20 + -0x38;
      lVar14 = lVar14 + -0x1c0;
    } while (1 < lVar23);
  }
  pAVar12 = aom_get_worker_interface();
  iVar9 = workers->had_error;
  if (iVar9 != 0) {
    memcpy(&local_1d0,(void *)((long)workers->data2 + 0x20),0x1a0);
  }
  if (1 < num_workers) {
    lVar23 = uVar15 + 1;
    pAVar25 = workers + uVar15;
    do {
      iVar11 = (*pAVar12->sync)(pAVar25 + -1);
      if (iVar11 == 0) {
        memcpy(&local_1d0,(void *)((long)pAVar25[-1].data2 + 0x20),0x1a0);
        iVar9 = 1;
      }
      lVar23 = lVar23 + -1;
      pAVar25 = pAVar25 + -1;
    } while (2 < lVar23);
  }
  if (iVar9 != 0) {
    aom_internal_error_copy(cm->error,&local_1d0);
  }
  return;
}

Assistant:

void av1_loop_restoration_filter_frame_mt(YV12_BUFFER_CONFIG *frame,
                                          AV1_COMMON *cm, int optimized_lr,
                                          AVxWorker *workers, int num_workers,
                                          AV1LrSync *lr_sync, void *lr_ctxt,
                                          int do_extend_border) {
  assert(!cm->features.all_lossless);

  const int num_planes = av1_num_planes(cm);

  AV1LrStruct *loop_rest_ctxt = (AV1LrStruct *)lr_ctxt;

  av1_loop_restoration_filter_frame_init(loop_rest_ctxt, frame, cm,
                                         optimized_lr, num_planes);

  foreach_rest_unit_in_planes_mt(loop_rest_ctxt, workers, num_workers, lr_sync,
                                 cm, do_extend_border);
}